

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ggml_cgraph * magika_graph(magika_model *model,int n_files)

{
  int iVar1;
  undefined8 uVar2;
  ggml_cgraph *pgVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  allocator_type local_49;
  size_t local_48;
  pointer puStack_40;
  undefined1 local_38;
  
  if (magika_graph(magika_model_const&,int)::buf_size == '\0') {
    iVar1 = __cxa_guard_acquire(&magika_graph(magika_model_const&,int)::buf_size);
    if (iVar1 != 0) {
      lVar6 = ggml_tensor_overhead();
      lVar5 = ggml_graph_overhead();
      magika_graph::buf_size = lVar5 + lVar6 * 0x800;
      __cxa_guard_release(&magika_graph(magika_model_const&,int)::buf_size);
    }
  }
  if (magika_graph(magika_model_const&,int)::buf == '\0') {
    iVar1 = __cxa_guard_acquire(&magika_graph(magika_model_const&,int)::buf);
    if (iVar1 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&magika_graph::buf,magika_graph::buf_size,&local_49);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &magika_graph::buf,&__dso_handle);
      __cxa_guard_release(&magika_graph(magika_model_const&,int)::buf);
    }
  }
  local_48 = magika_graph::buf_size;
  puStack_40 = magika_graph::buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_38 = 1;
  uVar2 = ggml_init();
  pgVar3 = (ggml_cgraph *)ggml_new_graph(uVar2);
  lVar6 = (long)n_files;
  uVar4 = ggml_new_tensor_3d(uVar2,0,0x101,0x600,lVar6);
  ggml_set_name(uVar4,"input");
  ggml_set_input(uVar4);
  uVar4 = ggml_mul_mat(uVar2,model->dense_w,uVar4);
  uVar4 = ggml_add(uVar2,uVar4,model->dense_b);
  uVar4 = ggml_gelu(uVar2,uVar4);
  uVar4 = ggml_reshape_3d(uVar2,uVar4,0x200,0x180,lVar6);
  uVar4 = ggml_transpose(uVar2,uVar4);
  uVar4 = ggml_cont(uVar2,uVar4);
  uVar4 = ggml_norm((model->hparams).f_norm_eps,uVar2,uVar4);
  uVar4 = ggml_mul(uVar2,uVar4,model->layer_norm_gamma);
  uVar4 = ggml_add(uVar2,uVar4,model->layer_norm_beta);
  uVar4 = ggml_transpose(uVar2,uVar4);
  uVar4 = ggml_cont(uVar2,uVar4);
  uVar4 = ggml_mul_mat(uVar2,model->dense_1_w,uVar4);
  uVar4 = ggml_add(uVar2,uVar4,model->dense_1_b);
  uVar4 = ggml_gelu(uVar2,uVar4);
  uVar4 = ggml_mul_mat(uVar2,model->dense_2_w,uVar4);
  uVar4 = ggml_add(uVar2,uVar4,model->dense_2_b);
  uVar4 = ggml_gelu(uVar2,uVar4);
  uVar4 = ggml_transpose(uVar2,uVar4);
  uVar4 = ggml_cont(uVar2,uVar4);
  uVar4 = ggml_pool_1d(uVar2,uVar4,0,0x180,0x180,0);
  uVar4 = ggml_reshape_2d(uVar2,uVar4,0x100,lVar6);
  uVar4 = ggml_norm((model->hparams).f_norm_eps,uVar2,uVar4);
  uVar4 = ggml_mul(uVar2,uVar4,model->layer_norm_1_gamma);
  uVar4 = ggml_add(uVar2,uVar4,model->layer_norm_1_beta);
  uVar4 = ggml_mul_mat(uVar2,model->target_label_w,uVar4);
  uVar4 = ggml_add(uVar2,uVar4,model->target_label_b);
  uVar2 = ggml_soft_max(uVar2,uVar4);
  ggml_set_name(uVar2,"target_label_probs");
  ggml_set_output(uVar2);
  ggml_build_forward_expand(pgVar3,uVar2);
  return pgVar3;
}

Assistant:

struct ggml_cgraph * magika_graph(
    const magika_model & model,
    const int n_files) {

    const auto & hparams = model.hparams;

    static size_t buf_size = ggml_tensor_overhead()*GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead();
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true,
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph * gf = ggml_new_graph(ctx);

    struct ggml_tensor * input = ggml_new_tensor_3d(ctx, GGML_TYPE_F32, 257, 1536, n_files); // one-hot
    ggml_set_name(input, "input");
    ggml_set_input(input);

    struct ggml_tensor * cur;

    // dense
    cur = ggml_mul_mat(ctx, model.dense_w, input);
    cur = ggml_add(ctx, cur, model.dense_b); // [128, 1536, n_files]
    cur = ggml_gelu(ctx, cur);

    // reshape
    cur = ggml_reshape_3d(ctx, cur, 512, 384, n_files); // [384, 512, n_files]
    cur = ggml_cont(ctx, ggml_transpose(ctx, cur));

    // layer normalization
    cur = ggml_norm(ctx, cur, hparams.f_norm_eps);
    cur = ggml_mul(ctx, cur, model.layer_norm_gamma); // [384, 512, n_files]
    cur = ggml_add(ctx, cur, model.layer_norm_beta);  // [384, 512, n_files]

    // dense_1
    cur = ggml_cont(ctx, ggml_transpose(ctx, cur));
    cur = ggml_mul_mat(ctx, model.dense_1_w, cur);
    cur = ggml_add(ctx, cur, model.dense_1_b); // [256, 384, n_files]
    cur = ggml_gelu(ctx, cur);

    // dense_2
    cur = ggml_mul_mat(ctx, model.dense_2_w, cur);
    cur = ggml_add(ctx, cur, model.dense_2_b); // [256, 384, n_files]
    cur = ggml_gelu(ctx, cur);

    // global_max_pooling1d
    cur = ggml_cont(ctx, ggml_transpose(ctx, cur)); // [384, 256, n_files]
    cur = ggml_pool_1d(ctx, cur, GGML_OP_POOL_MAX, 384, 384, 0); // [1, 256, n_files]
    cur = ggml_reshape_2d(ctx, cur, 256, n_files); // [256, n_files]

    // layer normalization 1
    cur = ggml_norm(ctx, cur, hparams.f_norm_eps);
    cur = ggml_mul(ctx, cur, model.layer_norm_1_gamma); // [256, n_files]
    cur = ggml_add(ctx, cur, model.layer_norm_1_beta);  // [256, n_files]

    // target_label
    cur = ggml_mul_mat(ctx, model.target_label_w, cur);
    cur = ggml_add(ctx, cur, model.target_label_b); // [n_label, n_files]
    cur = ggml_soft_max(ctx, cur); // [n_label, n_files]
    ggml_set_name(cur, "target_label_probs");
    ggml_set_output(cur);

    ggml_build_forward_expand(gf, cur);

    return gf;
}